

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpruneL.c
# Opt level: O0

void zpruneL(int jcol,int *perm_r,int pivrow,int nseg,int *segrep,int *repfnz,int_t *xprune,
            GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int_t iVar3;
  int *piVar4;
  int *piVar5;
  int_t *piVar6;
  int_t *piVar7;
  void *pvVar8;
  int_t *piVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  int_t *xlusup;
  doublecomplex *lusup;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int do_prune;
  int_t maxloc;
  int_t minloc;
  int_t ktemp;
  int_t i;
  int movnum;
  int krow;
  int kmax;
  int kmin;
  int irep1;
  int irep;
  int jsupno;
  doublecomplex utemp;
  int *repfnz_local;
  int *segrep_local;
  int nseg_local;
  int pivrow_local;
  int *perm_r_local;
  int jcol_local;
  
  piVar4 = Glu->xsup;
  piVar5 = Glu->supno;
  piVar6 = Glu->lsub;
  piVar7 = Glu->xlsub;
  pvVar8 = Glu->lusup;
  piVar9 = Glu->xlusup;
  iVar1 = piVar5[jcol];
  minloc = 0;
  do {
    if (nseg <= minloc) {
      return;
    }
    iVar2 = segrep[minloc];
    iVar13 = iVar2 + 1;
    bVar12 = false;
    if (((repfnz[iVar2] != -1) && (piVar5[iVar2] != piVar5[iVar13])) && (piVar5[iVar2] != iVar1)) {
      if (piVar7[iVar13] <= xprune[iVar2]) {
        movnum = piVar7[iVar13] + -1;
        krow = piVar7[iVar2];
        for (i = krow; i <= movnum; i = i + 1) {
          if (piVar6[i] == pivrow) {
            bVar12 = true;
            break;
          }
        }
      }
      if (bVar12) {
        iVar13 = piVar4[piVar5[iVar2]];
        while (krow <= movnum) {
          if (perm_r[piVar6[movnum]] == -1) {
            movnum = movnum + -1;
          }
          else {
            if (perm_r[piVar6[krow]] == -1) {
              iVar3 = piVar6[krow];
              piVar6[krow] = piVar6[movnum];
              piVar6[movnum] = iVar3;
              if (iVar2 == iVar13) {
                iVar14 = piVar9[iVar2] + (krow - piVar7[iVar2]);
                iVar15 = piVar9[iVar2] + (movnum - piVar7[iVar2]);
                puVar16 = (undefined8 *)((long)pvVar8 + (long)iVar14 * 0x10);
                uVar10 = *puVar16;
                uVar11 = puVar16[1];
                puVar16 = (undefined8 *)((long)pvVar8 + (long)iVar14 * 0x10);
                puVar17 = (undefined8 *)((long)pvVar8 + (long)iVar15 * 0x10);
                *puVar16 = *puVar17;
                puVar16[1] = puVar17[1];
                puVar16 = (undefined8 *)((long)pvVar8 + (long)iVar15 * 0x10);
                *puVar16 = uVar10;
                puVar16[1] = uVar11;
              }
              movnum = movnum + -1;
            }
            krow = krow + 1;
          }
        }
        xprune[iVar2] = krow;
      }
    }
    minloc = minloc + 1;
  } while( true );
}

Assistant:

void
zpruneL(
       const int  jcol,	     /* in */
       const int  *perm_r,   /* in */
       const int  pivrow,    /* in */
       const int  nseg,	     /* in */
       const int  *segrep,   /* in */
       const int  *repfnz,   /* in */
       int_t      *xprune,   /* out */
       GlobalLU_t *Glu       /* modified - global LU data structures */
       )
{

    doublecomplex     utemp;
    int        jsupno, irep, irep1, kmin, kmax, krow, movnum;
    int_t      i, ktemp, minloc, maxloc;
    int        do_prune; /* logical variable */
    int        *xsup, *supno;
    int_t      *lsub, *xlsub;
    doublecomplex     *lusup;
    int_t      *xlusup;

    xsup       = Glu->xsup;
    supno      = Glu->supno;
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (doublecomplex *) Glu->lusup;
    xlusup     = Glu->xlusup;
    
    /*
     * For each supernode-rep irep in U[*,j]
     */
    jsupno = supno[jcol];
    for (i = 0; i < nseg; i++) {

	irep = segrep[i];
	irep1 = irep + 1;
	do_prune = FALSE;

	/* Don't prune with a zero U-segment */
 	if ( repfnz[irep] == SLU_EMPTY )
		continue;

     	/* If a snode overlaps with the next panel, then the U-segment 
   	 * is fragmented into two parts -- irep and irep1. We should let
	 * pruning occur at the rep-column in irep1's snode. 
	 */
	if ( supno[irep] == supno[irep1] ) 	/* Don't prune */
		continue;

	/*
	 * If it has not been pruned & it has a nonz in row L[pivrow,i]
	 */
	if ( supno[irep] != jsupno ) {
	    if ( xprune[irep] >= xlsub[irep1] ) {
		kmin = xlsub[irep];
		kmax = xlsub[irep1] - 1;
		for (krow = kmin; krow <= kmax; krow++) 
		    if ( lsub[krow] == pivrow ) {
			do_prune = TRUE;
			break;
		    }
	    }
	    
    	    if ( do_prune ) {

	     	/* Do a quicksort-type partition
	     	 * movnum=TRUE means that the num values have to be exchanged.
	     	 */
	        movnum = FALSE;
	        if ( irep == xsup[supno[irep]] ) /* Snode of size 1 */
			movnum = TRUE;

	        while ( kmin <= kmax ) {

	    	    if ( perm_r[lsub[kmax]] == SLU_EMPTY ) 
			kmax--;
		    else if ( perm_r[lsub[kmin]] != SLU_EMPTY )
			kmin++;
		    else { /* kmin below pivrow (not yet pivoted), and kmax
                            * above pivrow: interchange the two subscripts
			    */
		        ktemp = lsub[kmin];
		        lsub[kmin] = lsub[kmax];
		        lsub[kmax] = ktemp;

			/* If the supernode has only one column, then we
 			 * only keep one set of subscripts. For any subscript 
			 * interchange performed, similar interchange must be 
			 * done on the numerical values.
 			 */
		        if ( movnum ) {
		    	    minloc = xlusup[irep] + (kmin - xlsub[irep]);
		    	    maxloc = xlusup[irep] + (kmax - xlsub[irep]);
			    utemp = lusup[minloc];
		  	    lusup[minloc] = lusup[maxloc];
			    lusup[maxloc] = utemp;
		        }

		        kmin++;
		        kmax--;

		    }

	        } /* while */

	        xprune[irep] = kmin;	/* Pruning */

#ifdef CHK_PRUNE
	printf("    After zpruneL(),using col %d:  xprune[%d] = %d\n", 
			jcol, irep, kmin);
#endif
	    } /* if do_prune */

	} /* if */

    } /* for each U-segment... */
}